

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O0

void aom_hadamard_8x8_c(int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff)

{
  long in_RDX;
  ptrdiff_t in_RSI;
  int16_t *in_RDI;
  int j;
  int i;
  int16_t *tmp_buf;
  int16_t buffer2 [64];
  int16_t buffer [64];
  int idx;
  int local_138;
  int local_134;
  int16_t *local_130;
  int16_t local_128 [64];
  int16_t local_a8 [70];
  int local_1c;
  long local_18;
  ptrdiff_t local_10;
  int16_t *local_8;
  
  local_130 = local_a8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
    hadamard_col8(local_8,local_10,local_130);
    local_130 = local_130 + 8;
    local_8 = local_8 + 1;
  }
  local_130 = local_a8;
  for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
    hadamard_col8(local_130,8,local_128 + (local_1c << 3));
    local_130 = local_130 + 1;
  }
  for (local_134 = 0; local_134 < 8; local_134 = local_134 + 1) {
    for (local_138 = 0; local_138 < 8; local_138 = local_138 + 1) {
      *(int *)(local_18 + (long)(local_134 * 8 + local_138) * 4) =
           (int)local_128[local_138 * 8 + local_134];
    }
  }
  return;
}

Assistant:

void aom_hadamard_8x8_c(const int16_t *src_diff, ptrdiff_t src_stride,
                        tran_low_t *coeff) {
  int idx;
  int16_t buffer[64];
  int16_t buffer2[64];
  int16_t *tmp_buf = &buffer[0];
  for (idx = 0; idx < 8; ++idx) {
    hadamard_col8(src_diff, src_stride, tmp_buf);  // src_diff: 9 bit
                                                   // dynamic range [-255, 255]
    tmp_buf += 8;
    ++src_diff;
  }

  tmp_buf = &buffer[0];
  for (idx = 0; idx < 8; ++idx) {
    hadamard_col8(tmp_buf, 8, buffer2 + 8 * idx);  // tmp_buf: 12 bit
    // dynamic range [-2040, 2040]
    // buffer2: 15 bit
    // dynamic range [-16320, 16320]
    ++tmp_buf;
  }

  // Extra transpose to match SSE2 behavior(i.e., aom_hadamard_8x8_sse2).
  for (int i = 0; i < 8; i++) {
    for (int j = 0; j < 8; j++) {
      coeff[i * 8 + j] = (tran_low_t)buffer2[j * 8 + i];
    }
  }
}